

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::GaussianNoise::forward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_RDI;
  Tensor m;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  Dim *in_stack_fffffffffffffee8;
  Tensor *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff00;
  Tensor *in_stack_ffffffffffffff08;
  real in_stack_ffffffffffffff10;
  real in_stack_ffffffffffffff14;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_60 [2];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  this_00 = local_60;
  local_10 = in_RSI;
  Tensor::Tensor(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(float *)this_00);
  TensorTools::RandomizeNormal
            (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
  Tensor::operator*(in_stack_ffffffffffffff08);
  Tensor::operator*(in_stack_ffffffffffffff08);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Tensor::operator*(in_stack_ffffffffffffff08);
  Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=(this_00,in_RDI);
  Tensor::~Tensor((Tensor *)0x36a86d);
  return;
}

Assistant:

void GaussianNoise::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomizeNormal(0, stddev, m);
  (*fx) = **xs[0] + *m;
#endif
}